

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ToObject(JSContext *ctx,JSValue val)

{
  JSValue this_obj;
  JSValue v;
  JSValue v_00;
  int iVar1;
  undefined8 in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar2;
  JSString *p1;
  JSValue obj;
  int tag;
  int in_stack_ffffffffffffff1c;
  JSContext *in_stack_ffffffffffffff20;
  JSValue in_stack_ffffffffffffff40;
  JSValue in_stack_ffffffffffffff50;
  JSValueUnion JVar3;
  int64_t in_stack_ffffffffffffff88;
  JSValueUnion local_68;
  undefined4 uStack_5c;
  undefined4 local_38;
  undefined4 uStack_34;
  JSValueUnion local_30;
  int64_t local_28;
  JSAtom in_stack_fffffffffffffff4;
  
  local_38 = (undefined4)in_RDX;
  uStack_34 = (undefined4)((ulong)in_RDX >> 0x20);
  switch(local_38) {
  case 0:
  case 7:
    JVar2 = JS_NewObjectClass(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_68 = JVar2.u;
    local_28._0_4_ = (int)JVar2.tag;
    uStack_5c = JVar2.tag._4_4_;
    break;
  case 1:
    in_stack_ffffffffffffff50 =
         JS_NewObjectClass(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_68 = in_stack_ffffffffffffff50.u;
    local_28._0_4_ = (int)in_stack_ffffffffffffff50.tag;
    uStack_5c = in_stack_ffffffffffffff50.tag._4_4_;
    break;
  case 0xfffffff8:
    in_stack_ffffffffffffff40 =
         JS_NewObjectClass(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_68 = in_stack_ffffffffffffff40.u;
    local_28._0_4_ = (int)in_stack_ffffffffffffff40.tag;
    uStack_5c = in_stack_ffffffffffffff40.tag._4_4_;
    break;
  case 0xfffffff9:
    JVar3 = in_RSI;
    JVar2 = JS_NewObjectClass(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_68 = JVar2.u;
    local_28._0_4_ = (int)JVar2.tag;
    uStack_5c = JVar2.tag._4_4_;
    this_obj.tag = in_stack_ffffffffffffff88;
    this_obj.u.ptr = JVar3.ptr;
    JS_DefinePropertyValue((JSContext *)0x0,this_obj,in_stack_fffffffffffffff4,JVar2,(int)local_28);
    break;
  default:
  case 2:
  case 3:
    JVar2 = JS_ThrowTypeError(in_RDI,"cannot convert to object");
    return JVar2;
  case 0xffffffff:
  case 6:
    JVar2.tag._0_4_ = local_38;
    JVar2.u.ptr = in_RSI.ptr;
    JVar2.tag._4_4_ = uStack_34;
    JVar2 = JS_DupValue(in_RDI,JVar2);
    return JVar2;
  }
  v.tag._0_4_ = (int)local_28;
  v.u.ptr = local_68.ptr;
  v.tag._4_4_ = uStack_5c;
  iVar1 = JS_IsException(v);
  if (iVar1 == 0) {
    v_00.tag._0_4_ = local_38;
    v_00.u.ptr = in_RSI.ptr;
    v_00.tag._4_4_ = uStack_34;
    JVar2 = JS_DupValue(in_RDI,v_00);
    JS_SetObjectData((JSContext *)JVar2.tag,in_stack_ffffffffffffff50,in_stack_ffffffffffffff40);
  }
  local_28._4_4_ = uStack_5c;
  local_30.ptr = local_68.ptr;
  return _local_30;
}

Assistant:

static JSValue JS_ToObject(JSContext *ctx, JSValueConst val)
{
    int tag = JS_VALUE_GET_NORM_TAG(val);
    JSValue obj;

    switch(tag) {
    default:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        return JS_ThrowTypeError(ctx, "cannot convert to object");
    case JS_TAG_OBJECT:
    case JS_TAG_EXCEPTION:
        return JS_DupValue(ctx, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_INT);
        goto set_value;
    case JS_TAG_BIG_FLOAT:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_FLOAT);
        goto set_value;
    case JS_TAG_BIG_DECIMAL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BIG_DECIMAL);
        goto set_value;
#endif
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
        obj = JS_NewObjectClass(ctx, JS_CLASS_NUMBER);
        goto set_value;
    case JS_TAG_STRING:
        /* XXX: should call the string constructor */
        {
            JSString *p1 = JS_VALUE_GET_STRING(val);
            obj = JS_NewObjectClass(ctx, JS_CLASS_STRING);
            JS_DefinePropertyValue(ctx, obj, JS_ATOM_length, JS_NewInt32(ctx, p1->len), 0);
        }
        goto set_value;
    case JS_TAG_BOOL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_BOOLEAN);
        goto set_value;
    case JS_TAG_SYMBOL:
        obj = JS_NewObjectClass(ctx, JS_CLASS_SYMBOL);
    set_value:
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, JS_DupValue(ctx, val));
        return obj;
    }
}